

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> *
anon_unknown.dwarf_35f635::getNameLoc
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation>
           *__return_storage_ptr__,HierarchicalInstanceSyntax *syntax)

{
  Token local_68;
  SourceLocation local_58;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  SourceLocation local_40;
  string_view local_38;
  SourceLocation local_28;
  SourceLocation loc;
  string_view name;
  HierarchicalInstanceSyntax *syntax_local;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&loc);
  slang::SourceLocation::SourceLocation(&local_28);
  if (syntax->decl == (InstanceNameSyntax *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"");
    loc = (SourceLocation)local_50._M_len;
    local_68 = slang::syntax::SyntaxNode::getFirstToken(&syntax->super_SyntaxNode);
    local_58 = slang::parsing::Token::location(&local_68);
    local_28 = local_58;
  }
  else {
    local_38 = slang::parsing::Token::valueText(&syntax->decl->name);
    loc = (SourceLocation)local_38._M_len;
    local_40 = slang::parsing::Token::location(&syntax->decl->name);
    local_28 = local_40;
  }
  std::make_pair<std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&>
            (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&loc,
             &local_28);
  return __return_storage_ptr__;
}

Assistant:

std::pair<string_view, SourceLocation> getNameLoc(const HierarchicalInstanceSyntax& syntax) {
    string_view name;
    SourceLocation loc;
    if (syntax.decl) {
        name = syntax.decl->name.valueText();
        loc = syntax.decl->name.location();
    }
    else {
        name = "";
        loc = syntax.getFirstToken().location();
    }
    return std::make_pair(name, loc);
}